

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

bool __thiscall
Jupiter::Database::create_database(Database *this,string_view file,DataBuffer *header)

{
  bool bVar1;
  size_type sVar2;
  char *file_00;
  const_pointer __src;
  bool r;
  char *str;
  DataBuffer *header_local;
  string_view file_local;
  
  file_local._M_len = file._M_len;
  header_local = (DataBuffer *)this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&header_local);
  file_00 = (char *)operator_new__(sVar2 + 1);
  __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&header_local);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&header_local);
  memcpy(file_00,__src,sVar2);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&header_local);
  file_00[sVar2] = '\0';
  bVar1 = create_database(file_00,(DataBuffer *)file._M_str);
  if (file_00 != (char *)0x0) {
    operator_delete__(file_00);
  }
  return bVar1;
}

Assistant:

bool Jupiter::Database::create_database(std::string_view file, const Jupiter::DataBuffer *header)
{
	char *str = new char[file.size() + 1];
	memcpy(str, file.data(), file.size() * sizeof(char));
	str[file.size()] = '\0';
	bool r = Jupiter::Database::create_database(str, header);
	delete[] str;
	return r;
}